

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iremga20.c
# Opt level: O1

UINT8 irem_ga20_r(void *info,UINT8 offset)

{
  if ((~(uint)offset & 7) == 0) {
    return *(UINT8 *)((long)info + (ulong)((offset & 0x1f) >> 3) * 0x1c + 0x4c);
  }
  return '\0';
}

Assistant:

static UINT8 irem_ga20_r(void *info, UINT8 offset)
{
	ga20_state *chip = (ga20_state *)info;
	int channel;

	offset &= 0x1F;
	channel = offset >> 3;

	switch (offset & 0x7)
	{
		case 7: // voice status. bit 0 is 1 if active. (routine around 0xccc in rtypeleo)
			return chip->channel[channel].play;

		default:
			logerror("GA20: read unk. register %d, channel %d\n", offset & 0x7, channel);
			break;
	}

	return 0;
}